

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::emit_buffer_reference_block
          (CompilerGLSL *this,SPIRType *type,bool forward_declaration)

{
  uint uVar1;
  byte bVar2;
  bool bVar3;
  uint32_t uVar4;
  ulong uVar5;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar6;
  bool local_209;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8 [32];
  SPIRType *local_1a8;
  SPIRType *pointee_type;
  string local_198 [32];
  TypedID *local_178;
  TypedID<(spirv_cross::Types)1> *member;
  TypedID<(spirv_cross::Types)1> *__end3;
  TypedID<(spirv_cross::Types)1> *__begin3;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *__range3;
  undefined1 local_150 [4];
  uint32_t i;
  string local_130 [32];
  string local_110 [32];
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_f0;
  char local_e8;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_e0;
  char local_d8;
  spirv_cross local_d0 [32];
  spirv_cross local_b0 [32];
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_90;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_88;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_80;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_78 [3];
  string local_60 [32];
  string local_40 [8];
  string buffer_name;
  bool forward_declaration_local;
  SPIRType *type_local;
  CompilerGLSL *this_local;
  
  ::std::__cxx11::string::string(local_40);
  if (forward_declaration) {
    uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
    (*(this->super_Compiler)._vptr_Compiler[6])(local_60,this,(ulong)uVar4,0);
    ::std::__cxx11::string::operator=(local_40,local_60);
    ::std::__cxx11::string::~string(local_60);
    ::std::
    unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
    ::operator[](&(this->super_Compiler).ir.meta,&(type->super_IVariant).self);
    bVar2 = ::std::__cxx11::string::empty();
    local_209 = true;
    if ((bVar2 & 1) == 0) {
      local_78[0]._M_cur =
           (__node_type *)
           ::std::
           unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find(&this->block_ssbo_names,(key_type *)local_40);
      local_80._M_cur =
           (__node_type *)
           ::std::
           end<std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                     (&this->block_ssbo_names);
      bVar3 = ::std::__detail::operator!=(local_78,&local_80);
      local_209 = true;
      if (!bVar3) {
        local_88._M_cur =
             (__node_type *)
             ::std::
             unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::find(&this->resource_names,(key_type *)local_40);
        local_90._M_cur =
             (__node_type *)
             ::std::
             end<std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                       (&this->resource_names);
        local_209 = ::std::__detail::operator!=(&local_88,&local_90);
      }
    }
    if (local_209 != false) {
      join<char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>&>
                (local_b0,(char (*) [2])0x4e3b4c,&(type->super_IVariant).self);
      ::std::__cxx11::string::operator=(local_40,(string *)local_b0);
      ::std::__cxx11::string::~string((string *)local_b0);
    }
    add_variable(this,&this->block_ssbo_names,&this->resource_names,(string *)local_40);
    uVar5 = ::std::__cxx11::string::empty();
    if ((uVar5 & 1) != 0) {
      join<char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>&>
                (local_d0,(char (*) [2])0x4e3b4c,&(type->super_IVariant).self);
      ::std::__cxx11::string::operator=(local_40,(string *)local_d0);
      ::std::__cxx11::string::~string((string *)local_d0);
    }
    pVar6 = ::std::
            unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->block_names,(value_type *)local_40);
    local_e0._M_cur =
         (__node_type *)
         pVar6.first.
         super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
         ._M_cur;
    local_d8 = pVar6.second;
    pVar6 = ::std::
            unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->block_ssbo_names,(value_type *)local_40);
    local_f0._M_cur =
         (__node_type *)
         pVar6.first.
         super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
         ._M_cur;
    local_e8 = pVar6.second;
  }
  else if (*(int *)&(type->super_IVariant).field_0xc == 0xf) {
    uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
    (*(this->super_Compiler)._vptr_Compiler[6])(local_130,this,(ulong)uVar4,0);
    ::std::__cxx11::string::operator=(local_40,local_130);
    ::std::__cxx11::string::~string(local_130);
  }
  else {
    (*(this->super_Compiler)._vptr_Compiler[0x13])(local_110,this,type,0);
    ::std::__cxx11::string::operator=(local_40,local_110);
    ::std::__cxx11::string::~string(local_110);
  }
  if (forward_declaration) {
    statement<char_const(&)[33],std::__cxx11::string&,char_const(&)[2]>
              (this,(char (*) [33])"layout(buffer_reference) buffer ",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
               (char (*) [2])0x4d9ce2);
  }
  else {
    if (*(int *)&(type->super_IVariant).field_0xc == 0xf) {
      buffer_to_packing_standard_abi_cxx11_
                ((CompilerGLSL *)local_150,(SPIRType *)this,SUB81(type,0));
      statement<char_const(&)[26],std::__cxx11::string,char_const(&)[10],std::__cxx11::string&>
                (this,(char (*) [26])"layout(buffer_reference, ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150,
                 (char (*) [10])0x4dab1f,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
      ::std::__cxx11::string::~string((string *)local_150);
    }
    else {
      statement<char_const(&)[33],std::__cxx11::string&>
                (this,(char (*) [33])"layout(buffer_reference) buffer ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
    }
    begin_scope(this);
    if (*(int *)&(type->super_IVariant).field_0xc == 0xf) {
      ::std::
      unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&type->member_name_cache);
      __range3._4_4_ = 0;
      __begin3 = (TypedID<(spirv_cross::Types)1> *)&type->member_types;
      __end3 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::begin
                         ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)__begin3);
      member = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::end
                         ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)__begin3);
      for (; __end3 != member; __end3 = __end3 + 1) {
        local_178 = (TypedID *)__end3;
        add_member_name(this,type,__range3._4_4_);
        uVar4 = TypedID::operator_cast_to_unsigned_int(local_178);
        uVar1 = __range3._4_4_;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_198,"",(allocator *)((long)&pointee_type + 7));
        (*(this->super_Compiler)._vptr_Compiler[0x15])
                  (this,type,(ulong)uVar4,(ulong)uVar1,local_198,0);
        ::std::__cxx11::string::~string(local_198);
        ::std::allocator<char>::~allocator((allocator<char> *)((long)&pointee_type + 7));
        __range3._4_4_ = __range3._4_4_ + 1;
      }
    }
    else {
      local_1a8 = Compiler::get_pointee_type(&this->super_Compiler,type);
      (*(this->super_Compiler)._vptr_Compiler[0x13])(local_1c8,this,local_1a8,0);
      (*(this->super_Compiler)._vptr_Compiler[0x23])(local_1e8,this,local_1a8);
      statement<std::__cxx11::string,char_const(&)[7],std::__cxx11::string,char_const(&)[2]>
                (this,local_1c8,(char (*) [7])" value",local_1e8,(char (*) [2])0x4d9ce2);
      ::std::__cxx11::string::~string((string *)local_1e8);
      ::std::__cxx11::string::~string((string *)local_1c8);
    }
    end_scope_decl(this);
    statement<char_const(&)[1]>(this,(char (*) [1])0x4d8596);
  }
  ::std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void CompilerGLSL::emit_buffer_reference_block(SPIRType &type, bool forward_declaration)
{
	string buffer_name;

	if (forward_declaration)
	{
		// Block names should never alias, but from HLSL input they kind of can because block types are reused for UAVs ...
		// Allow aliased name since we might be declaring the block twice. Once with buffer reference (forward declared) and one proper declaration.
		// The names must match up.
		buffer_name = to_name(type.self, false);

		// Shaders never use the block by interface name, so we don't
		// have to track this other than updating name caches.
		// If we have a collision for any reason, just fallback immediately.
		if (ir.meta[type.self].decoration.alias.empty() ||
		    block_ssbo_names.find(buffer_name) != end(block_ssbo_names) ||
		    resource_names.find(buffer_name) != end(resource_names))
		{
			buffer_name = join("_", type.self);
		}

		// Make sure we get something unique for both global name scope and block name scope.
		// See GLSL 4.5 spec: section 4.3.9 for details.
		add_variable(block_ssbo_names, resource_names, buffer_name);

		// If for some reason buffer_name is an illegal name, make a final fallback to a workaround name.
		// This cannot conflict with anything else, so we're safe now.
		// We cannot reuse this fallback name in neither global scope (blocked by block_names) nor block name scope.
		if (buffer_name.empty())
			buffer_name = join("_", type.self);

		block_names.insert(buffer_name);
		block_ssbo_names.insert(buffer_name);
	}
	else if (type.basetype != SPIRType::Struct)
		buffer_name = type_to_glsl(type);
	else
		buffer_name = to_name(type.self, false);

	if (!forward_declaration)
	{
		if (type.basetype == SPIRType::Struct)
			statement("layout(buffer_reference, ", buffer_to_packing_standard(type, true), ") buffer ", buffer_name);
		else
			statement("layout(buffer_reference) buffer ", buffer_name);

		begin_scope();

		if (type.basetype == SPIRType::Struct)
		{
			type.member_name_cache.clear();

			uint32_t i = 0;
			for (auto &member : type.member_types)
			{
				add_member_name(type, i);
				emit_struct_member(type, member, i);
				i++;
			}
		}
		else
		{
			auto &pointee_type = get_pointee_type(type);
			statement(type_to_glsl(pointee_type), " value", type_to_array_glsl(pointee_type), ";");
		}

		end_scope_decl();
		statement("");
	}
	else
	{
		statement("layout(buffer_reference) buffer ", buffer_name, ";");
	}
}